

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_48 [8];
  tst_qpromise_timeout tc;
  QCoreApplication local_28 [8];
  QCoreApplication app;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QTest::Internal::callInitMain<tst_qpromise_timeout>();
  QCoreApplication::QCoreApplication(local_28,(int *)&argv_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_qpromise_timeout::tst_qpromise_timeout((tst_qpromise_timeout *)local_48);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O0/tests/auto/qtpromise/qpromise"
            );
  argv_local._4_4_ = QTest::qExec((QObject *)local_48,(int)argv_local,argv);
  tst_qpromise_timeout::~tst_qpromise_timeout((tst_qpromise_timeout *)local_48);
  QCoreApplication::~QCoreApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

void tst_qpromise_timeout::fulfilled()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
                 QTimer::singleShot(1000, [=]() {
                     resolve(42);
                 });
             }}.timeout(2000)
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(p.isFulfilled(), true);
    QVERIFY(elapsed < 2000);
}